

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O1

int adj_lev(d_level *dlev,permonst *ptr)

{
  xchar xVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (ptr != mons + 0x128) {
    iVar5 = (int)ptr->mlevel;
    iVar3 = 0x32;
    if (iVar5 < 0x32) {
      xVar1 = level_difficulty(dlev);
      uVar2 = (int)xVar1 - (int)ptr->mlevel;
      if ((int)uVar2 < 0) {
        iVar5 = iVar5 + -1;
      }
      else {
        iVar5 = uVar2 / 5 + iVar5;
      }
      iVar3 = ptr->mlevel * 3;
      iVar3 = (int)(short)iVar3 - (iVar3 >> 0x1f) >> 1;
      iVar4 = 0x31;
      if (iVar3 < 0x31) {
        iVar4 = iVar3;
      }
      iVar3 = 0;
      if (0 < iVar5) {
        iVar3 = iVar5;
      }
      if (iVar4 < iVar5) {
        iVar3 = iVar4;
      }
    }
    return iVar3;
  }
  uVar2 = 0x31;
  if (mvitals[0x128].died + 0x1e < 0x31) {
    uVar2 = mvitals[0x128].died + 0x1e;
  }
  return uVar2;
}

Assistant:

int adj_lev(const d_level *dlev, const struct permonst *ptr)
{
	int	tmp, tmp2;

	if (ptr == &mons[PM_WIZARD_OF_YENDOR]) {
		/* does not depend on other strengths, but does get stronger
		 * every time he is killed
		 */
		tmp = ptr->mlevel + mvitals[PM_WIZARD_OF_YENDOR].died;
		if (tmp > 49) tmp = 49;
		return tmp;
	}

	if (ptr->mlevel > 49) return 50; /* "special" demons/devils */
	tmp = ptr->mlevel;
	tmp2 = level_difficulty(dlev) - ptr->mlevel;
	if (tmp2 < 0) tmp--;		/* if mlevel > u.uz decrement tmp */
	else tmp += (tmp2 / 5);		/* else increment 1 per five diff */

	tmp2 = (3 * ptr->mlevel)/ 2;	/* crude upper limit */
	if (tmp2 > 49) tmp2 = 49;		/* hard upper limit */
	return (tmp > tmp2) ? tmp2 : (tmp > 0 ? tmp : 0); /* 0 lower limit */
}